

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

void __thiscall
ShadowPass::execute(ShadowPass *this,vector<Object,_std::allocator<Object>_> *objects,
                   mat4 lightMatrix)

{
  ulong uVar1;
  Block *pBVar2;
  GpuCtx *pGVar3;
  pointer pOVar4;
  ulong uVar5;
  undefined8 uVar6;
  uint uVar7;
  ExplicitProducer *pEVar8;
  ExplicitProducer *extraout_RAX;
  GpuCtxWrapper *pGVar9;
  ExplicitProducer *extraout_RAX_00;
  ExplicitProducer *extraout_RAX_01;
  ExplicitProducer *extraout_RAX_02;
  ExplicitProducer *pEVar10;
  uint uVar11;
  ulong uVar12;
  pointer __src;
  allocator<char> local_1b2;
  GLScopedDebugGroup local_1b1;
  Shader *local_1b0;
  vector<Object,_std::allocator<Object>_> *local_1a8;
  string local_1a0;
  string local_180;
  Object obj;
  mat4 local_70;
  
  local_1a8 = objects;
  pEVar8 = tracy::GetToken();
  uVar1 = (pEVar8->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  pEVar10 = pEVar8;
  if ((uVar1 & 0xffff) == 0) {
    tracy::moodycamel::
    ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar8,uVar1);
    pEVar10 = extraout_RAX;
  }
  pBVar2 = (pEVar8->super_ProducerBase).tailBlock;
  uVar12 = (ulong)(uint)((int)(uVar1 & 0xffff) << 5);
  (pBVar2->field_0).elements[uVar12] = '\x0f';
  uVar5 = rdtsc();
  *(ulong *)((long)&pBVar2->field_0 + uVar12 + 1) =
       (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar10 >> 0x20),(int)uVar5);
  *(SourceLocationData **)((long)&pBVar2->field_0 + uVar12 + 9) =
       &execute::__tracy_source_location328;
  (pEVar8->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar1 + 1;
  pGVar9 = tracy::GetGpuCtx();
  pGVar3 = pGVar9->ptr;
  uVar7 = pGVar3->m_head;
  uVar11 = uVar7 + 1 & 0xffff;
  pGVar3->m_head = uVar11;
  uVar6 = gl3wProcs.ptr[0x1b1];
  if (uVar11 != pGVar3->m_tail) {
    pGVar9 = tracy::GetGpuCtx();
    (*(code *)uVar6)((ulong)pGVar9->ptr->m_query[uVar7],0x8e28);
    pEVar8 = tracy::GetToken();
    uVar1 = (pEVar8->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
    pEVar10 = pEVar8;
    if ((uVar1 & 0xffff) == 0) {
      tracy::moodycamel::
      ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
      ExplicitProducer::enqueue_begin_alloc(pEVar8,uVar1);
      pEVar10 = extraout_RAX_00;
    }
    pBVar2 = (pEVar8->super_ProducerBase).tailBlock;
    uVar12 = (ulong)(uint)((int)(uVar1 & 0xffff) << 5);
    (pBVar2->field_0).elements[uVar12] = '!';
    uVar5 = rdtsc();
    *(ulong *)((long)&pBVar2->field_0 + uVar12 + 1) =
         (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar10 >> 0x20),(int)uVar5);
    *(undefined4 *)((long)&pBVar2->field_0 + uVar12 + 9) = 0;
    *(short *)((long)&pBVar2->field_0 + uVar12 + 0xd) = (short)uVar7;
    pGVar9 = tracy::GetGpuCtx();
    (pBVar2->field_0).elements[uVar12 + 0xf] = pGVar9->ptr->m_context;
    *(SourceLocationData **)((long)&pBVar2->field_0 + uVar12 + 0x10) =
         &execute::__tracy_gpu_source_location329;
    (pEVar8->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar1 + 1;
    (*gl3wProcs.ptr[0x1b0])(0x824a,0,0xffffffffffffffff,"Shadow map");
    GLScopedDebugGroup::~GLScopedDebugGroup(&local_1b1);
    (*gl3wProcs.ptr[0x28c])(0,0,0x800,0x800);
    (*gl3wProcs.ptr[0x66])(0x404);
    (*gl3wProcs.ptr[0xf])(0x8d40,(ulong)this->fbo);
    (*gl3wProcs.ptr[0x2e])(0x100);
    uVar6 = gl3wProcs.ptr[0x22f];
    local_1b0 = &this->program;
    uVar7 = Shader::id(local_1b0);
    (*(code *)uVar6)((ulong)uVar7);
    uVar6 = gl3wProcs.ptr[0x227];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"lightSpaceMatrix",(allocator<char> *)&obj);
    uVar7 = Shader::getLoc(local_1b0,&local_1a0);
    (*(code *)uVar6)((ulong)uVar7,1,0,&lightMatrix);
    std::__cxx11::string::~string((string *)&local_1a0);
    pOVar4 = (local_1a8->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (__src = (local_1a8->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                 super__Vector_impl_data._M_start; __src != pOVar4; __src = __src + 1) {
      memcpy(&obj,__src,0xf0);
      (*gl3wProcs.ptr[0x1a])((ulong)obj.mesh.vao);
      uVar6 = gl3wProcs.ptr[0x227];
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"model",&local_1b2);
      uVar7 = Shader::getLoc(local_1b0,&local_180);
      Transform::getMatrix(&local_70,&obj.transform);
      (*(code *)uVar6)((ulong)uVar7,1,0,&local_70);
      std::__cxx11::string::~string((string *)&local_180);
      (*gl3wProcs.ptr[0x89])(4,(ulong)obj.mesh.numIndices,0x1405,0);
    }
    (*gl3wProcs.ptr[0x66])(0x405);
    pGVar9 = tracy::GetGpuCtx();
    pGVar3 = pGVar9->ptr;
    uVar7 = pGVar3->m_head;
    uVar11 = uVar7 + 1 & 0xffff;
    pGVar3->m_head = uVar11;
    uVar6 = gl3wProcs.ptr[0x1b1];
    if (uVar11 != pGVar3->m_tail) {
      pGVar9 = tracy::GetGpuCtx();
      (*(code *)uVar6)((ulong)pGVar9->ptr->m_query[uVar7],0x8e28);
      pEVar8 = tracy::GetToken();
      uVar1 = (pEVar8->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
      pEVar10 = pEVar8;
      if ((uVar1 & 0xffff) == 0) {
        tracy::moodycamel::
        ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
        ExplicitProducer::enqueue_begin_alloc(pEVar8,uVar1);
        pEVar10 = extraout_RAX_01;
      }
      pBVar2 = (pEVar8->super_ProducerBase).tailBlock;
      uVar12 = (ulong)(uint)((int)(uVar1 & 0xffff) << 5);
      (pBVar2->field_0).elements[uVar12] = '%';
      uVar5 = rdtsc();
      *(ulong *)((long)&pBVar2->field_0 + uVar12 + 1) =
           (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar10 >> 0x20),(int)uVar5);
      *(undefined4 *)((long)&pBVar2->field_0 + uVar12 + 9) = 0;
      *(short *)((long)&pBVar2->field_0 + uVar12 + 0xd) = (short)uVar7;
      pGVar9 = tracy::GetGpuCtx();
      (pBVar2->field_0).elements[uVar12 + 0xf] = pGVar9->ptr->m_context;
      (pEVar8->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar1 + 1;
      pEVar8 = tracy::GetToken();
      uVar1 = (pEVar8->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
      pEVar10 = pEVar8;
      if ((uVar1 & 0xffff) == 0) {
        tracy::moodycamel::
        ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
        ExplicitProducer::enqueue_begin_alloc(pEVar8,uVar1);
        pEVar10 = extraout_RAX_02;
      }
      pBVar2 = (pEVar8->super_ProducerBase).tailBlock;
      uVar12 = (ulong)(uint)((int)(uVar1 & 0xffff) << 5);
      (pBVar2->field_0).elements[uVar12] = '\x11';
      uVar5 = rdtsc();
      *(ulong *)((long)&pBVar2->field_0 + uVar12 + 1) =
           (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar10 >> 0x20),(int)uVar5);
      (pEVar8->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar1 + 1;
      return;
    }
  }
  __assert_fail("m_head != m_tail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/TracyOpenGL.hpp"
                ,0xb4,"unsigned int tracy::GpuCtx::NextQueryId()");
}

Assistant:

void ShadowPass::execute(const std::vector<Object>& objects, glm::mat4 lightMatrix)
{
    ZoneScopedN("Shadow map");
    TracyGpuZone("Shadow map");
    GLScopedDebugGroup("Shadow map");

    // === DIRECTIONAL SHADOW MAP PASS ===
    glViewport(0, 0, 2048, 2048);
    glCullFace(GL_FRONT);
    glBindFramebuffer(GL_FRAMEBUFFER, fbo);
    glClear(GL_DEPTH_BUFFER_BIT);

    glUseProgram(program.id());

    glUniformMatrix4fv(program.getLoc("lightSpaceMatrix"), 1, GL_FALSE, glm::value_ptr(lightMatrix));

    for (auto obj : objects) {
        glBindVertexArray(obj.mesh.vao);
        glUniformMatrix4fv(program.getLoc("model"), 1, GL_FALSE, glm::value_ptr(obj.transform.getMatrix()));
        glDrawElements(GL_TRIANGLES, obj.mesh.numIndices, GL_UNSIGNED_INT, (void*)0);
    }

    glCullFace(GL_BACK);
}